

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall Excel::Exception::~Exception(Exception *this)

{
  runtime_error *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__Exception_0014c7d0;
  std::__cxx11::wstring::~wstring((wstring *)(in_RDI + 0x10));
  std::runtime_error::~runtime_error(in_RDI);
  return;
}

Assistant:

inline
Exception::~Exception() noexcept
{
}